

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

bool slang::ast::checkMatch(CaseStatementCondition condition,ConstantValue *cvl,ConstantValue *cvr)

{
  bool bVar1;
  SVInt *pSVar2;
  SVInt *pSVar3;
  SVInt *r;
  SVInt *l;
  ConstantValue *local_80;
  ConstantValue *elem;
  CVConstIterator __end4;
  CVConstIterator __begin4;
  ConstantValue *__range4;
  ConstantValue *cvr_local;
  ConstantValue *cvl_local;
  CaseStatementCondition condition_local;
  
  if (condition == Inside) {
    bVar1 = slang::ConstantValue::isContainer(cvr);
    if (bVar1) {
      slang::begin((CVConstIterator *)
                   ((long)&__end4.current.
                           super__Variant_base<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                           .
                           super__Move_assign_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                           .
                           super__Copy_assign_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                           .
                           super__Move_ctor_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                           .
                           super__Copy_ctor_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                   + 0x20),cvr);
      slang::end((CVConstIterator *)&elem,cvr);
      while( true ) {
        bVar1 = iterator_facade<slang::CVConstIterator,_std::bidirectional_iterator_tag,_const_slang::ConstantValue,_long,_const_slang::ConstantValue_*,_const_slang::ConstantValue_&>
                ::operator!=((iterator_facade<slang::CVConstIterator,_std::bidirectional_iterator_tag,_const_slang::ConstantValue,_long,_const_slang::ConstantValue_*,_const_slang::ConstantValue_&>
                              *)((long)&__end4.current.
                                        super__Variant_base<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                                        .
                                        super__Move_assign_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                                        .
                                        super__Copy_assign_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                                        .
                                        super__Move_ctor_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                                        .
                                        super__Copy_ctor_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                                + 0x20),(CVConstIterator *)&elem);
        if (!bVar1) {
          return false;
        }
        local_80 = CVConstIterator::operator*
                             ((CVConstIterator *)
                              ((long)&__end4.current.
                                      super__Variant_base<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                                      .
                                      super__Move_assign_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                                      .
                                      super__Copy_assign_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                                      .
                                      super__Move_ctor_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                                      .
                                      super__Copy_ctor_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                              + 0x20));
        bVar1 = checkMatch(Inside,cvl,local_80);
        if (bVar1) break;
        CVConstIterator::operator++
                  ((CVConstIterator *)
                   ((long)&__end4.current.
                           super__Variant_base<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                           .
                           super__Move_assign_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                           .
                           super__Copy_assign_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                           .
                           super__Move_ctor_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                           .
                           super__Copy_ctor_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                   + 0x20));
      }
      return true;
    }
    bVar1 = slang::ConstantValue::isInteger(cvl);
    if ((bVar1) && (bVar1 = slang::ConstantValue::isInteger(cvr), bVar1)) {
      pSVar2 = slang::ConstantValue::integer(cvl);
      pSVar3 = slang::ConstantValue::integer(cvr);
      l._7_1_ = condWildcardEqual(pSVar2,pSVar3);
      bVar1 = logic_t::operator_cast_to_bool((logic_t *)((long)&l + 7));
      return bVar1;
    }
  }
  else if (condition != Normal) {
    pSVar2 = slang::ConstantValue::integer(cvl);
    pSVar3 = slang::ConstantValue::integer(cvr);
    if (condition == WildcardJustZ) {
      bVar1 = caseZWildcardEqual(pSVar2,pSVar3);
      return bVar1;
    }
    bVar1 = caseXWildcardEqual(pSVar2,pSVar3);
    return bVar1;
  }
  bVar1 = slang::operator==(cvl,cvr);
  return bVar1;
}

Assistant:

static bool checkMatch(CaseStatementCondition condition, const ConstantValue& cvl,
                       const ConstantValue& cvr) {
    if (condition == CaseStatementCondition::Inside) {
        // Unpacked arrays get unwrapped into their members for comparison.
        if (cvr.isContainer()) {
            for (auto& elem : cvr) {
                if (checkMatch(condition, cvl, elem))
                    return true;
            }
            return false;
        }

        // Otherwise, we do a wildcard comparison if both sides are integers
        // and an equivalence comparison if not.
        if (cvl.isInteger() && cvr.isInteger())
            return (bool)condWildcardEqual(cvl.integer(), cvr.integer());
    }
    else if (condition != CaseStatementCondition::Normal) {
        const SVInt& l = cvl.integer();
        const SVInt& r = cvr.integer();
        if (condition == CaseStatementCondition::WildcardJustZ)
            return caseZWildcardEqual(l, r);
        else
            return caseXWildcardEqual(l, r);
    }

    return cvl == cvr;
}